

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O1

void __thiscall
Memory::RecyclerSweepManager::BeginSweep
          (RecyclerSweepManager *this,Recycler *recycler,size_t rescanRootBytes,
          bool adjustPartialHeuristics)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  AutoFilterExceptionRegion local_34 [2];
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(local_34,ExceptionType_All);
  this->recycler = recycler;
  (*recycler->collectionWrapper->_vptr_RecyclerCollectionWrapper[1])();
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(local_34);
  BVar3 = Recycler::IsSweeping(recycler);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x41,"(!recycler->IsSweeping())","!recycler->IsSweeping()");
    if (!bVar2) goto LAB_007377f4;
    *puVar4 = 0;
  }
  if (recycler->recyclerSweepManager != (RecyclerSweepManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x42,"(recycler->recyclerSweepManager == nullptr)",
                       "recycler->recyclerSweepManager == nullptr");
    if (!bVar2) goto LAB_007377f4;
    *puVar4 = 0;
  }
  memset(this,0,0x3d08);
  this->recycler = recycler;
  recycler->recyclerSweepManager = this;
  RecyclerSweep::BeginSweep
            (&this->defaultHeapRecyclerSweep,recycler,this,&(recycler->autoHeap).defaultHeap);
  if ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
      (recycler->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next !=
      &recycler->clientTrackedObjectList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x4b,"(recycler->clientTrackedObjectList.Empty())",
                       "recycler->clientTrackedObjectList.Empty()");
    if (!bVar2) goto LAB_007377f4;
    *puVar4 = 0;
  }
  if ((recycler->partialUncollectedAllocBytes != 0) && (recycler->inPartialCollectMode == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x4e,
                       "(recycler->partialUncollectedAllocBytes == 0 || recycler->inPartialCollectMode)"
                       ,
                       "recycler->partialUncollectedAllocBytes == 0 || recycler->inPartialCollectMode"
                      );
    if (!bVar2) goto LAB_007377f4;
    *puVar4 = 0;
  }
  if ((recycler->autoHeap).uncollectedAllocBytes < recycler->partialUncollectedAllocBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x4f,
                       "(recycler->autoHeap.uncollectedAllocBytes >= recycler->partialUncollectedAllocBytes)"
                       ,
                       "recycler->autoHeap.uncollectedAllocBytes >= recycler->partialUncollectedAllocBytes"
                      );
    if (!bVar2) goto LAB_007377f4;
    *puVar4 = 0;
  }
  this->rescanRootBytes = rescanRootBytes;
  (recycler->collectionStats).rescanRootBytes = rescanRootBytes;
  if (((this->recycler->enablePartialCollect == true) && (rescanRootBytes < 0x500001)) &&
     ((this->recycler->autoHeap).unusedPartialCollectFreeBytes < 0x1000001)) {
    this->partial = true;
    this->adjustPartialHeuristics = adjustPartialHeuristics;
    StartPartialCollectMode(this);
  }
  else {
    if (recycler->inPartialCollectMode == true) {
      Recycler::FinishPartialCollect(recycler,(RecyclerSweepManager *)0x0);
    }
    if (recycler->partialUncollectedAllocBytes != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x6a,"(recycler->partialUncollectedAllocBytes == 0)",
                         "recycler->partialUncollectedAllocBytes == 0");
      if (!bVar2) goto LAB_007377f4;
      *puVar4 = 0;
    }
    if (recycler->inPartialCollectMode == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x6c,"(!recycler->inPartialCollectMode)","!recycler->inPartialCollectMode"
                        );
      if (!bVar2) {
LAB_007377f4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  if (this->inPartialCollect == true) {
    Recycler::ResetHeuristicCounters(recycler);
  }
  else {
    Recycler::ResetPartialHeuristicCounters(recycler);
  }
  return;
}

Assistant:

void
RecyclerSweepManager::BeginSweep(Recycler * recycler)
#endif
{
    {
        // We are about to sweep, give the runtime a chance to see the now-immutable state of the world.
        // And clean up all the cache not monitor by the GC (e.g. inline caches)
        AUTO_NO_EXCEPTION_REGION;

        // RecyclerSweep may not be initialized till later in this function but
        // GCETW relies on the recycler pointer being correctly set up
        this->recycler = recycler;
        GCETW(GC_PRESWEEPCALLBACK_START, (this));
        recycler->collectionWrapper->PreSweepCallback();
        GCETW(GC_PRESWEEPCALLBACK_STOP, (this));
    }

    Assert(!recycler->IsSweeping());
    Assert(recycler->recyclerSweepManager == nullptr);

    memset(this, 0, sizeof(RecyclerSweepManager));
    this->recycler = recycler;
    recycler->recyclerSweepManager = this;

    this->defaultHeapRecyclerSweep.BeginSweep(recycler, this, recycler->autoHeap.GetDefaultHeap());

#if ENABLE_PARTIAL_GC
    Assert(recycler->clientTrackedObjectList.Empty());

    // We should not have partialUncollectedAllocBytes unless we are in partial collect at this point
    Assert(recycler->partialUncollectedAllocBytes == 0 || recycler->inPartialCollectMode);
    Assert(recycler->autoHeap.uncollectedAllocBytes >= recycler->partialUncollectedAllocBytes);

    // if the cost of rescan is too high, we want to disable partial GC starting from the
    // upcoming Sweep. We basically move the check up from AdjustPartialHeuristics to here
    // such that we can have the decision before sweep.

    this->rescanRootBytes = rescanRootBytes;

    RECYCLER_STATS_SET(recycler, rescanRootBytes, rescanRootBytes);

    if (this->DoPartialCollectMode())
    {
        // enable partial collect for sweep & next round of GC
        DebugOnly(this->partial = true);

        // REVIEW: is adjustPartialHeuristicsMode  the same as in PartialCollectMode?
        this->adjustPartialHeuristics = adjustPartialHeuristics;
        this->StartPartialCollectMode();
    }
    else
    {
        // disable partial collect
        if (recycler->inPartialCollectMode)
        {
            recycler->FinishPartialCollect();
        }

        Assert(recycler->partialUncollectedAllocBytes == 0);

        Assert(!recycler->inPartialCollectMode);
    }

    if (this->inPartialCollect)
    {
        // We just did a partial collect.
        // We only want to count objects that survived this collect towards the next full GC.
        // Thus, clear out uncollectedAllocBytes here; we will adjust to account for objects that
        // survived this partial collect in EndSweep.
        recycler->ResetHeuristicCounters();
    }
    else
#endif
    {
        Assert(!this->inPartialCollect);
        // We just did a full collect.
        // We reset uncollectedAllocBytes when we kicked off the collection,
        // so don't reset it here (but do reset partial heuristics).
        recycler->ResetPartialHeuristicCounters();
    }
}